

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O3

void __thiscall OperandValue::saveXml(OperandValue *this,ostream *s)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<operand_exp",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(s," index=\"",8);
  *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) =
       *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = (ostream *)std::ostream::operator<<(s,this->index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(s," table=\"0x",10);
  *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) =
       *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(s," ct=\"0x",7);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"/>\n",4);
  return;
}

Assistant:

void OperandValue::saveXml(ostream &s) const

{
  s << "<operand_exp";
  s << " index=\"" << dec << index << "\"";
  s << " table=\"0x" << hex << ct->getParent()->getId() << "\"";
  s << " ct=\"0x" << ct->getId() << "\"/>\n"; // Save id of our constructor
}